

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.h
# Opt level: O0

basic_ostream<char,_std::char_traits<char>_> *
date::detail::operator<<
          (basic_ostream<char,_std::char_traits<char>_> *os,
          decimal_format_seconds<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_6U> *x)

{
  long lVar1;
  char cVar2;
  _Ios_Fmtflags __fmtfl;
  rep_conflict rVar3;
  ostream *poVar4;
  ios_base local_48 [24];
  undefined1 local_30 [8];
  save_stream<char,_std::char_traits<char>_> _;
  decimal_format_seconds<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_6U> *x_local;
  basic_ostream<char,_std::char_traits<char>_> *os_local;
  
  _._16_8_ = x;
  save_stream<char,_std::char_traits<char>_>::save_stream
            ((save_stream<char,_std::char_traits<char>_> *)local_30,os);
  std::ios::fill((char)os + (char)*(undefined8 *)(*(long *)os + -0x18));
  lVar1 = *(long *)(*(long *)os + -0x18);
  __fmtfl = std::operator|(_S_dec,_S_right);
  std::ios_base::flags((ios_base *)(os + lVar1),__fmtfl);
  std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),2);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count
                    ((duration<long,_std::ratio<1L,_1L>_> *)_._16_8_);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)os,rVar3);
  std::ios_base::getloc(local_48);
  std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_48);
  cVar2 = std::__cxx11::numpunct<char>::decimal_point();
  std::operator<<(poVar4,cVar2);
  std::locale::~locale((locale *)local_48);
  std::ios_base::width((ios_base *)(os + *(long *)(*(long *)os + -0x18)),6);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)(_._16_8_ + 8));
  std::ostream::operator<<((ostream *)os,rVar3);
  save_stream<char,_std::char_traits<char>_>::~save_stream
            ((save_stream<char,_std::char_traits<char>_> *)local_30);
  return os;
}

Assistant:

std::basic_ostream<CharT, Traits>&
    operator<<(std::basic_ostream<CharT, Traits>& os, const decimal_format_seconds& x)
    {
        date::detail::save_stream<CharT, Traits> _(os);
        os.fill('0');
        os.flags(std::ios::dec | std::ios::right);
        os.width(2);
        os << x.s_.count() <<
              std::use_facet<std::numpunct<char>>(os.getloc()).decimal_point();
        os.width(width);
        os << static_cast<std::int64_t>(x.sub_s_.count());
        return os;
    }